

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3MatchinfoSelectDoctotal
              (Fts3Table *pTab,sqlite3_stmt **ppStmt,sqlite3_int64 *pnDoc,char **paLen)

{
  int iVar1;
  Mem *pVal;
  char *p;
  int iVar2;
  sqlite3_stmt *pStmt;
  sqlite3_int64 nDoc;
  ulong local_30;
  
  pStmt = *ppStmt;
  if (pStmt == (sqlite3_stmt *)0x0) {
    iVar1 = sqlite3Fts3SelectDoctotal(pTab,ppStmt);
    if (iVar1 != 0) {
      return iVar1;
    }
    pStmt = *ppStmt;
  }
  pVal = columnMem(pStmt,0);
  p = (char *)sqlite3_value_blob(pVal);
  columnMallocFailure(pStmt);
  iVar1 = sqlite3Fts3GetVarint(p,(sqlite_int64 *)&local_30);
  if (local_30 == 0) {
    iVar2 = 0x10b;
  }
  else {
    *pnDoc = local_30 & 0xffffffff;
    iVar2 = 0;
    if (paLen != (char **)0x0) {
      *paLen = p + iVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int fts3MatchinfoSelectDoctotal(
  Fts3Table *pTab,
  sqlite3_stmt **ppStmt,
  sqlite3_int64 *pnDoc,
  const char **paLen
){
  sqlite3_stmt *pStmt;
  const char *a;
  sqlite3_int64 nDoc;

  if( !*ppStmt ){
    int rc = sqlite3Fts3SelectDoctotal(pTab, ppStmt);
    if( rc!=SQLITE_OK ) return rc;
  }
  pStmt = *ppStmt;
  assert( sqlite3_data_count(pStmt)==1 );

  a = sqlite3_column_blob(pStmt, 0);
  a += sqlite3Fts3GetVarint(a, &nDoc);
  if( nDoc==0 ) return FTS_CORRUPT_VTAB;
  *pnDoc = (u32)nDoc;

  if( paLen ) *paLen = a;
  return SQLITE_OK;
}